

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O2

qreal __thiscall QGraphicsItemAnimation::verticalShearAt(QGraphicsItemAnimation *this,qreal step)

{
  char *this_00;
  qreal qVar1;
  
  this_00 = "verticalShearAt";
  check_step_valid(step,"verticalShearAt");
  qVar1 = QGraphicsItemAnimationPrivate::linearValueForStep
                    ((QGraphicsItemAnimationPrivate *)this_00,step,
                     (QList<QGraphicsItemAnimationPrivate::Pair> *)(*(long *)(this + 0x10) + 0x100),
                     0.0);
  return qVar1;
}

Assistant:

qreal QGraphicsItemAnimation::verticalShearAt(qreal step) const
{
    check_step_valid(step, "verticalShearAt");
    return d->linearValueForStep(step, d->verticalShear, 0);
}